

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable
          (ParseFunctionGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  char acVar1 [8];
  bool bVar2;
  FileDescriptor *file;
  pointer pTVar3;
  size_type in_RCX;
  size_type extraout_RDX;
  Span<const_unsigned_char> data;
  Span<const_google::protobuf::FieldDescriptor_*const> field_descriptors;
  Sub *local_bc8;
  basic_string_view<char,_std::char_traits<char>_> local_ae0;
  undefined1 local_ac9;
  anon_class_16_2_d7082a65_for_cb local_ac8;
  allocator<char> local_ab1;
  string local_ab0;
  anon_class_24_3_5fbd9a84_for_cb local_a90;
  allocator<char> local_a71;
  string local_a70;
  anon_class_16_2_66b46a60_for_cb local_a50;
  allocator<char> local_a39;
  string local_a38;
  anon_class_16_2_d7082a65_for_cb local_a18;
  allocator<char> local_a01;
  string local_a00;
  allocator<char> local_9d9;
  string local_9d8;
  int local_9b8;
  allocator<char> local_9b1;
  string local_9b0;
  cpp *local_990;
  pointer local_988;
  int local_980;
  allocator<char> local_979;
  string local_978;
  size_type local_958;
  allocator<char> local_949;
  string local_948;
  size_type local_928;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f1;
  string local_8f0;
  char *local_8d0;
  allocator<char> local_8c1;
  string local_8c0;
  Sub *local_8a0;
  Sub local_898;
  Sub local_7e0;
  Sub local_728;
  Sub local_670;
  Sub local_5b8;
  Sub local_500;
  Sub local_448;
  Sub local_390;
  Sub local_2d8;
  Sub local_220;
  Sub local_168;
  iterator local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a0;
  undefined1 local_90 [8];
  anon_class_16_2_fd512ddd_for_cb GenerateAuxEntries;
  anon_class_24_3_7db1d596_for_cb GenerateTableBase;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_58;
  undefined1 local_48 [8];
  NumToEntryTable field_num_to_entry_table;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  v;
  Printer *p_local;
  ParseFunctionGenerator *this_local;
  
  v.storage_.callback_buffer_ = (char  [8])p;
  protobuf::io::Printer::
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&,void,void>
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
              *)&field_num_to_entry_table.blocks.
                 super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,p,&this->variables_);
  absl::lts_20250127::Span<google::protobuf::FieldDescriptor_const*const>::
  Span<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,void,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,int>
            ((Span<google::protobuf::FieldDescriptor_const*const> *)local_58._M_local_buf,
             &this->ordered_fields_);
  field_descriptors.len_ = in_RCX;
  field_descriptors.ptr_ = (pointer)local_58._8_8_;
  MakeNumToEntryTable((NumToEntryTable *)local_48,(cpp *)local_58._M_allocated_capacity,
                      field_descriptors);
  acVar1 = v.storage_.callback_buffer_;
  GenerateAuxEntries.this = (ParseFunctionGenerator *)v.storage_.callback_buffer_;
  local_ac9 = 1;
  local_8a0 = &local_898;
  local_90 = (undefined1  [8])this;
  GenerateAuxEntries.p = (Printer **)GenerateAuxEntries.this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"const",&local_8c1);
  file = Descriptor::file(this->descriptor_);
  bVar2 = IsFileDescriptorProto(file,this->options_);
  local_8d0 = "PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\nconst";
  if (bVar2) {
    local_8d0 = "constexpr";
  }
  protobuf::io::Printer::Sub::Sub<char_const*>(&local_898,&local_8c0,&local_8d0);
  local_8a0 = &local_7e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,"table_size_log2",&local_8f1);
  pTVar3 = std::
           unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ::operator->(&this->tc_table_info_);
  protobuf::io::Printer::Sub::Sub<int&>(&local_7e0,&local_8f0,&pTVar3->table_size_log2);
  local_8a0 = &local_728;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_918,"ordered_size",&local_919)
  ;
  local_928 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->ordered_fields_);
  protobuf::io::Printer::Sub::Sub<unsigned_long>(&local_728,&local_918,&local_928);
  local_8a0 = &local_670;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"aux_size",&local_949);
  pTVar3 = std::
           unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ::operator->(&this->tc_table_info_);
  local_958 = std::
              vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              ::size(&pTVar3->aux_entries);
  protobuf::io::Printer::Sub::Sub<unsigned_long>(&local_670,&local_948,&local_958);
  local_8a0 = &local_5b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"data_size",&local_979);
  pTVar3 = std::
           unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ::operator->(&this->tc_table_info_);
  absl::lts_20250127::Span<unsigned_char_const>::
  Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>
            ((Span<unsigned_char_const> *)&local_990,&pTVar3->field_name_data);
  data.len_ = extraout_RDX;
  data.ptr_ = local_988;
  local_980 = FieldNameDataSize(local_990,data);
  protobuf::io::Printer::Sub::Sub<int>(&local_5b8,&local_978,&local_980);
  local_8a0 = &local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b0,"field_num_to_entry_table_size",&local_9b1);
  local_9b8 = NumToEntryTable::size16((NumToEntryTable *)local_48);
  protobuf::io::Printer::Sub::Sub<int>(&local_500,&local_9b0,&local_9b8);
  local_8a0 = &local_448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"table_base",&local_9d9);
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable(google::protobuf::io::Printer*)::__0&>
            (&local_448,&local_9d8,(anon_class_24_3_7db1d596_for_cb *)&GenerateAuxEntries.p);
  local_8a0 = &local_390;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a00,"fast_entries",&local_a01)
  ;
  local_a18.p = (Printer **)v.storage_.callback_buffer_;
  local_a18.this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable(google::protobuf::io::Printer*)::__1>
            (&local_390,&local_a00,&local_a18);
  local_8a0 = &local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a38,"field_lookup_table",&local_a39);
  local_a50.field_num_to_entry_table = (NumToEntryTable *)local_48;
  local_a50.p = (Printer **)v.storage_.callback_buffer_;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable(google::protobuf::io::Printer*)::__2>
            (&local_2d8,&local_a38,&local_a50);
  local_8a0 = &local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a70,"field_and_aux_entries",&local_a71);
  local_a90.p = (Printer **)v.storage_.callback_buffer_;
  local_a90.GenerateAuxEntries = (anon_class_16_2_fd512ddd_for_cb *)local_90;
  local_a90.this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable(google::protobuf::io::Printer*)::__3>
            (&local_220,&local_a70,&local_a90);
  local_8a0 = &local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab0,"field_names",&local_ab1);
  local_ac8.p = (Printer **)v.storage_.callback_buffer_;
  local_ac8.this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable(google::protobuf::io::Printer*)::__4>
            (&local_168,&local_ab0,&local_ac8);
  local_ac9 = 0;
  local_b0 = &local_898;
  local_a8 = 0xb;
  v_00._M_len = 0xb;
  v_00._M_array = local_b0;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_a0._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_ae0,
             "\n$const$ ::_pbi::TcParseTable<$table_size_log2$, $ordered_size$, $aux_size$, $data_size$, $field_num_to_entry_table_size$>\n$classname$::_table_ = {\n  {\n    $table_base$\n  }, {{\n    $fast_entries$\n  }}, {{\n    $field_lookup_table$\n  }}, $field_and_aux_entries$,\n  {{\n    $field_names$,\n  }},\n};\n"
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit
            ((Printer *)acVar1,local_a0._M_allocated_capacity,local_a0._8_8_,local_ae0._M_len,
             local_ae0._M_str);
  local_bc8 = (Sub *)&local_b0;
  do {
    local_bc8 = local_bc8 + -1;
    protobuf::io::Printer::Sub::~Sub(local_bc8);
  } while (local_bc8 != &local_898);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  std::__cxx11::string::~string((string *)&local_a70);
  std::allocator<char>::~allocator(&local_a71);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator(&local_a39);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator(&local_a01);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator(&local_9d9);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator(&local_979);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator(&local_949);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator(&local_8f1);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::allocator<char>::~allocator(&local_8c1);
  NumToEntryTable::~NumToEntryTable((NumToEntryTable *)local_48);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1039:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
              *)&field_num_to_entry_table.blocks.
                 super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailCallTable(io::Printer* p) {
  auto v = p->WithVars(variables_);
  // For simplicity and speed, the table is not covering all proto
  // configurations. This model uses a fallback to cover all situations that
  // the table can't accommodate, together with unknown fields or extensions.
  // These are number of fields over 32, fields with 3 or more tag bytes,
  // maps, weak fields, lazy, more than 1 extension range. In the cases
  // the table is sufficient we can use a generic routine, that just handles
  // unknown fields and potentially an extension range.
  NumToEntryTable field_num_to_entry_table =
      MakeNumToEntryTable(ordered_fields_);

  auto GenerateTableBase = [&] {
    p->Emit(
        {{"has_bits_offset",
          [&] {
            if (num_hasbits_ > 0 || IsMapEntryMessage(descriptor_)) {
              p->Emit(
                  "PROTOBUF_FIELD_OFFSET($classname$, _impl_._has_bits_),\n");
            } else {
              p->Emit("0,  // no _has_bits_\n");
            }
          }},
         {"extension_offset",
          [&] {
            if (descriptor_->extension_range_count() != 0) {
              p->Emit("PROTOBUF_FIELD_OFFSET($classname$, $extensions$),\n");
            } else {
              p->Emit("0, // no _extensions_\n");
            }
          }},
         {"max_field_number",
          ordered_fields_.empty() ? 0 : ordered_fields_.back()->number()},
         {"fast_idx_mask", (((1 << tc_table_info_->table_size_log2) - 1) << 3)},
         {"skipmap32", field_num_to_entry_table.skipmap32},
         {"field_entries_offset",
          [&] {
            if (ordered_fields_.empty()) {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_names),  // no field_entries
              )cc");
            } else {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_entries),
              )cc");
            }
          }},
         {"num_field_entries", ordered_fields_.size()},
         {"num_aux_entries", tc_table_info_->aux_entries.size()},
         {"aux_offset",
          [&] {
            if (tc_table_info_->aux_entries.empty()) {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_names),  // no aux_entries
              )cc");
            } else {
              p->Emit(R"cc(
                offsetof(decltype(_table_), aux_entries),
              )cc");
            }
          }},
         {"class_data", [&] { p->Emit("$classname$_class_data_.base(),\n"); }},
         {"post_loop_handler",
          [&] {
            if (NeedsPostLoopHandler(descriptor_, options_)) {
              p->Emit("&$classname$::PostLoopHandler,\n");
            } else {
              p->Emit("nullptr,  // post_loop_handler\n");
            }
          }},
         {"fallback", TcParseFunctionName(tc_table_info_->fallback_function)},
         {"to_prefetch",
          [&] {
            std::vector<const FieldDescriptor*> subtable_fields;
            for (const auto& aux : tc_table_info_->aux_entries) {
              if (aux.type == internal::TailCallTableInfo::kSubTable) {
                subtable_fields.push_back(aux.field);
              }
            }
            const auto* hottest = FindHottestField(subtable_fields, options_);
            p->Emit(
                {{"hot_type", QualifiedClassName(hottest == nullptr
                                                     ? descriptor_
                                                     : hottest->message_type(),
                                                 options_)}},
                R"cc(
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
                  ::_pbi::TcParser::GetTable<$hot_type$>(),  // to_prefetch
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE)cc");
          }}},
        // clang-format off
        R"cc(
        $has_bits_offset$,
        $extension_offset$,
        $max_field_number$, $fast_idx_mask$,  // max_field_number, fast_idx_mask
        offsetof(decltype(_table_), field_lookup_table),
        $skipmap32$,  // skipmap
        $field_entries_offset$,
        $num_field_entries$,  // num_field_entries
        $num_aux_entries$,  // num_aux_entries
        $aux_offset$,
        $class_data$,
        $post_loop_handler$,
        $fallback$,  // fallback
        $to_prefetch$)cc"
        // clang-format on
    );
  };

  auto GenerateAuxEntries = [&] {
    for (const auto& aux_entry : tc_table_info_->aux_entries) {
      switch (aux_entry.type) {
        case TailCallTableInfo::kNothing:
          p->Emit("{},\n");
          break;
        case TailCallTableInfo::kInlinedStringDonatedOffset:
          p->Emit(
              "{_fl::Offset{offsetof($classname$, "
              "_impl_._inlined_string_donated_)}},\n");
          break;
        case TailCallTableInfo::kSplitOffset:
          p->Emit("{_fl::Offset{offsetof($classname$, _impl_._split_)}},\n");
          break;
        case TailCallTableInfo::kSplitSizeof:
          p->Emit("{_fl::Offset{sizeof($classname$::Impl_::Split)}},\n");
          break;
        case TailCallTableInfo::kSubMessage:
          p->Emit({{"name", QualifiedDefaultInstanceName(
                                aux_entry.field->message_type(), options_)}},
                  "{::_pbi::FieldAuxDefaultMessage{}, &$name$},\n");
          break;
        case TailCallTableInfo::kSubTable:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->message_type(),
                                               options_)}},
                  "{::_pbi::TcParser::GetTable<$name$>()},\n");
          break;
        case TailCallTableInfo::kSubMessageWeak:
          p->Emit({{"ptr", QualifiedDefaultInstancePtr(
                               aux_entry.field->message_type(), options_)}},
                  "{::_pbi::FieldAuxDefaultMessage{}, &$ptr$},\n");
          break;
        case TailCallTableInfo::kMessageVerifyFunc:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->message_type(),
                                               options_)}},
                  "{$name$::InternalVerify},\n");
          break;
        case TailCallTableInfo::kSelfVerifyFunc:
          if (ShouldVerify(descriptor_, options_, scc_analyzer_)) {
            p->Emit("{&InternalVerify},\n");
          } else {
            p->Emit("{},\n");
          }
          break;
        case TailCallTableInfo::kEnumRange:
          p->Emit(
              {
                  {"first", aux_entry.enum_range.first},
                  {"last", aux_entry.enum_range.last},
              },
              "{$first$, $last$},\n");
          break;
        case TailCallTableInfo::kEnumValidator:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->enum_type(),
                                               options_)}},
                  "{::_pbi::FieldAuxEnumData{}, $name$_internal_data_},\n");
          break;
        case TailCallTableInfo::kNumericOffset:
          p->Emit(
              {
                  {"offset", aux_entry.offset},
              },
              "{_fl::Offset{$offset$}},\n");
          break;
        case TailCallTableInfo::kMapAuxInfo: {
          auto utf8_check = internal::cpp::GetUtf8CheckMode(
              aux_entry.field,
              GetOptimizeFor(aux_entry.field->file(), options_) ==
                  FileOptions::LITE_RUNTIME);
          auto* map_key = aux_entry.field->message_type()->map_key();
          auto* map_value = aux_entry.field->message_type()->map_value();
          const bool validated_enum =
              map_value->type() == FieldDescriptor::TYPE_ENUM &&
              !internal::cpp::HasPreservingUnknownEnumSemantics(map_value);
          p->Emit(
              {
                  {"strict", utf8_check == Utf8CheckMode::kStrict},
                  {"verify", utf8_check == Utf8CheckMode::kVerify},
                  {"validate", validated_enum},
                  {"key_wire", map_key->type()},
                  {"value_wire", map_value->type()},
                  {"is_lite",
                   !HasDescriptorMethods(aux_entry.field->file(), options_)},
              },
              R"cc(
                {::_pbi::TcParser::GetMapAuxInfo($strict$, $verify$, $validate$,
                                                 $key_wire$, $value_wire$,
                                                 $is_lite$)},
              )cc");
          break;
        }
      }
    }
  };

  p->Emit(
      {{"const",
        // FileDescriptorProto's table must be constant initialized. For MSVC
        // this means using `constexpr`. However, we can't use `constexpr`
        // for all tables because it breaks when crossing DLL boundaries.
        // FileDescriptorProto is safe from this.
        IsFileDescriptorProto(descriptor_->file(), options_)
            ? "constexpr"
            : "PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\nconst"},
       {"table_size_log2", tc_table_info_->table_size_log2},
       {"ordered_size", ordered_fields_.size()},
       {"aux_size", tc_table_info_->aux_entries.size()},
       {"data_size", FieldNameDataSize(tc_table_info_->field_name_data)},
       {"field_num_to_entry_table_size", field_num_to_entry_table.size16()},
       {"table_base", GenerateTableBase},
       {"fast_entries",
        [&] {
          // TODO: refactor this to use Emit.
          Formatter format(p, variables_);
          GenerateFastFieldEntries(format);
        }},
       {"field_lookup_table",
        [&] {
          for (SkipEntryBlock& entry_block : field_num_to_entry_table.blocks) {
            p->Emit(
                {
                    {"lower", entry_block.first_fnum & 65535},
                    {"upper", entry_block.first_fnum / 65536},
                    {"size", entry_block.entries.size()},
                },
                "$lower$, $upper$, $size$,\n");

            for (SkipEntry16 se16 : entry_block.entries) {
              p->Emit({{"skipmap", se16.skipmap},
                       {"offset", se16.field_entry_offset}},
                      R"cc(
                        $skipmap$, $offset$,
                      )cc");
            }
          }

          // The last entry of the skipmap are all 1's.
          p->Emit("65535, 65535\n");
        }},
       {"field_and_aux_entries",
        [&] {
          if (ordered_fields_.empty() &&
              !descriptor_->options().message_set_wire_format()) {
            ABSL_DLOG_IF(FATAL, !tc_table_info_->aux_entries.empty())
                << "Invalid message: " << descriptor_->full_name() << " has "
                << tc_table_info_->aux_entries.size()
                << " auxiliary field entries, but no fields";
            p->Emit("// no field_entries, or aux_entries\n");
            return;
          }

          p->Emit(
              {
                  {"field_entries",
                   [&] {
                     // TODO: refactor this to use Emit.
                     Formatter format(p, variables_);
                     GenerateFieldEntries(format);
                   }},
                  {"aux_entries",
                   [&] {
                     if (tc_table_info_->aux_entries.empty()) {
                       p->Emit("// no aux_entries\n");
                     } else {
                       p->Emit(
                           {
                               {"aux_entries_list", GenerateAuxEntries},
                           },
                           // clang-format off
                              R"cc(
                                {{
                                    $aux_entries_list$
                                }},
                              )cc"
                           // clang-format on
                       );
                     }
                   }},
              },
              // clang-format off
                 R"cc(
                 {{
                   $field_entries$,
                 }},
                 $aux_entries$)cc"
              // clang-format on
          );
        }},
       {"field_names",
        [&] {
          Formatter format(p, variables_);
          GenerateFieldNames(format);
        }}},
      // Disable clang-format, as we want to generate a denser table
      // representation than what clang-format typically wants. clang would
      // insert a newline at every brace, whereas we prefer {{ ... }} here.
      // clang-format off
R"cc(
$const$ ::_pbi::TcParseTable<$table_size_log2$, $ordered_size$, $aux_size$, $data_size$, $field_num_to_entry_table_size$>
$classname$::_table_ = {
  {
    $table_base$
  }, {{
    $fast_entries$
  }}, {{
    $field_lookup_table$
  }}, $field_and_aux_entries$,
  {{
    $field_names$,
  }},
};
)cc"
      // clang-format on
  );
}